

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_psubush_mips64(uint64_t fs,uint64_t ft)

{
  int local_34;
  uint local_2c;
  int r;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  _r = ft;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    local_34 = (uint)*(ushort *)((long)&vt + (ulong)local_2c * 2) -
               (uint)*(ushort *)((long)&r + (ulong)local_2c * 2);
    if (0xffff < local_34) {
      local_34 = 0xffff;
    }
    *(short *)((long)&vt + (ulong)local_2c * 2) = (short)local_34;
  }
  return vt.d;
}

Assistant:

uint64_t helper_psubush(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int r = vs.uh[i] - vt.uh[i];
        vs.uh[i] = SATUH(r);
    }
    return vs.d;
}